

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TagAliasRegistry::add
          (TagAliasRegistry *this,string *alias,string *tag,SourceLineInfo *lineInfo)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  domain_error *pdVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar5;
  Colour local_1fc;
  Colour local_1fb;
  Colour local_1fa;
  Colour local_1f9;
  Option<Catch::TagAlias> local_1f8;
  char *local_1b8;
  size_t sStack_1b0;
  ostringstream oss;
  
  std::__cxx11::string::string((string *)&oss,"[@",(allocator *)&local_1f8);
  bVar2 = startsWith(alias,(string *)&oss);
  if ((bVar2) && (alias->_M_string_length != 0)) {
    cVar1 = (alias->_M_dataplus)._M_p[alias->_M_string_length - 1];
    std::__cxx11::string::~string((string *)&oss);
    if (cVar1 == ']') {
      local_1b8 = lineInfo->file;
      sStack_1b0 = lineInfo->line;
      std::__cxx11::string::string((string *)&local_1f8,(string *)tag);
      local_1f8.field_1._16_8_ = local_1b8;
      local_1f8.field_1._24_8_ = sStack_1b0;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
      ::pair<Catch::TagAlias,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
                  *)&oss,alias,(TagAlias *)&local_1f8);
      pVar5 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagAlias>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                          *)&this->m_registry,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
                          *)&oss);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
               *)&oss);
      std::__cxx11::string::~string((string *)&local_1f8);
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      local_1fc.m_moved = false;
      Colour::use(Red);
      poVar3 = std::operator<<((ostream *)&oss,"error: tag alias, \"");
      poVar3 = std::operator<<(poVar3,(string *)alias);
      poVar3 = std::operator<<(poVar3,"\" already registered.\n");
      poVar3 = std::operator<<(poVar3,"\tFirst seen at ");
      local_1f9.m_moved = false;
      Colour::use(Red);
      (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(&local_1f8,this,alias);
      operator<<(poVar3,(SourceLineInfo *)
                        (CONCAT71(local_1f8.nullableValue._1_7_,local_1f8.nullableValue._0_1_) +
                        0x20));
      poVar3 = std::operator<<(poVar3,'\n');
      local_1fa.m_moved = false;
      Colour::use(Red);
      poVar3 = std::operator<<(poVar3,"\tRedefined at ");
      local_1fb.m_moved = false;
      Colour::use(FileName);
      operator<<(poVar3,lineInfo);
      std::operator<<(poVar3,'\n');
      Colour::~Colour(&local_1fb);
      Colour::~Colour(&local_1fa);
      Option<Catch::TagAlias>::reset(&local_1f8);
      Colour::~Colour(&local_1f9);
      Colour::~Colour(&local_1fc);
      pdVar4 = (domain_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::domain_error::domain_error
                (pdVar4,(char *)CONCAT71(local_1f8.nullableValue._1_7_,local_1f8.nullableValue._0_1_
                                        ));
      __cxa_throw(pdVar4,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&oss);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  local_1f8.nullableValue._0_1_ = 0;
  Colour::use(Red);
  poVar3 = std::operator<<((ostream *)&oss,"error: tag alias, \"");
  poVar3 = std::operator<<(poVar3,(string *)alias);
  poVar3 = std::operator<<(poVar3,"\" is not of the form [@alias name].\n");
  local_1fc.m_moved = false;
  Colour::use(FileName);
  operator<<(poVar3,lineInfo);
  std::operator<<(poVar3,'\n');
  Colour::~Colour(&local_1fc);
  Colour::~Colour((Colour *)&local_1f8);
  pdVar4 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error
            (pdVar4,(char *)CONCAT71(local_1f8.nullableValue._1_7_,local_1f8.nullableValue._0_1_));
  __cxa_throw(pdVar4,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( std::string const& alias, std::string const& tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, ']' ) ) {
            std::ostringstream oss;
            oss << Colour( Colour::Red )
                << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n"
                << Colour( Colour::FileName )
                << lineInfo << '\n';
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << Colour( Colour::Red )
                << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at "
                << Colour( Colour::Red ) << find(alias)->lineInfo << '\n'
                << Colour( Colour::Red ) << "\tRedefined at "
                << Colour( Colour::FileName) << lineInfo << '\n';
            throw std::domain_error( oss.str().c_str() );
        }
    }